

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_PageHandle.cc
# Opt level: O2

void * __thiscall MyDB_PageHandleBase::getBytes(MyDB_PageHandleBase *this)

{
  MyDB_PageBase *pMVar1;
  MyDB_BufferManager *pMVar2;
  MyDB_LRU *pMVar3;
  void *pvVar4;
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  __shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  pair<std::shared_ptr<MyDB_Table>,_long> local_88;
  pair<std::shared_ptr<MyDB_Table>,_long> local_70;
  pair<std::shared_ptr<MyDB_Table>,_long> local_58;
  pair<std::shared_ptr<MyDB_Table>,_long> local_40;
  
  std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_40,&this->pagePtr->pageId);
  pMVar1 = this->pagePtr;
  pMVar2 = this->bufferManager;
  if (pMVar1->addr == (void *)0x0) {
    pMVar3 = pMVar2->LRU;
    if ((pMVar2->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (pMVar2->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_70,&pMVar1->pageId);
      pvVar4 = MyDB_LRU::evictAndReplace(pMVar3,&local_70,this->pagePtr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_88,&pMVar1->pageId);
      MyDB_LRU::add(pMVar3,&local_88,this->pagePtr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pvVar4 = *(this->bufferManager->availPageQueue).c.
                super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur;
      std::deque<void_*,_std::allocator<void_*>_>::pop_front
                (&(this->bufferManager->availPageQueue).c);
    }
    pMVar1 = this->pagePtr;
    pMVar1->addr = pvVar4;
    std::__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_98,(__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> *)&pMVar1->pageId);
    MyDB_PageBase::readFromDisk
              (pMVar1,(MyDB_TablePtr *)&_Stack_98,(this->pagePtr->pageId).second,this->pagePtr->addr
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  }
  else {
    pMVar3 = pMVar2->LRU;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_58,&pMVar1->pageId);
    MyDB_LRU::adjust(pMVar3,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pvVar4 = this->pagePtr->addr;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return pvVar4;
}

Assistant:

void *MyDB_PageHandleBase :: getBytes () {
	//store the spare address in the buffer that we will return
	void* spareAddr;
	pair<MyDB_TablePtr, long> curId = this->pagePtr->pageId;

	//map<pair<MyDB_TablePtr, long>, MyDB_Page>::iterator it_pageMap = this->bufferManager->pageMap.find(curId);
	//If find this page in buffer
	if (this->pagePtr->addr != nullptr) {
		this -> bufferManager -> LRU -> adjust(this -> pagePtr -> pageId);
		spareAddr = this->pagePtr->addr;

	}

	//If this page is in the disk and we need to read from disk and put it in the buffer
	else {
		//If there is no empty space in the buffer
		if (this->bufferManager->availPageQueue.empty()) {
			spareAddr = this -> bufferManager -> LRU -> evictAndReplace(this -> pagePtr -> pageId, this -> pagePtr);
		}
		else {
			this -> bufferManager -> LRU -> add(this -> pagePtr -> pageId, this -> pagePtr);
			spareAddr = this -> bufferManager -> availPageQueue.front();
			this -> bufferManager -> availPageQueue.pop();
		}
		this -> pagePtr -> addr = spareAddr;
		this -> pagePtr -> readFromDisk(this -> pagePtr -> pageId.first, this -> pagePtr -> pageId.second, this -> pagePtr ->addr);
	}

	return spareAddr;
}